

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall asl::String::replaceme(String *this,char a,char b)

{
  anon_union_16_2_78e7fdac_for_String_2 *paVar1;
  char cVar2;
  
  if (this->_size == 0) {
    paVar1 = &this->field_2;
  }
  else {
    paVar1 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  do {
    cVar2 = paVar1->_space[0];
    if (paVar1->_space[0] == a) {
      paVar1->_space[0] = b;
      cVar2 = b;
    }
    paVar1 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)paVar1 + 1);
  } while (cVar2 != '\0');
  return this;
}

Assistant:

String& String::replaceme(char a, char b)
{
	char* p = str();
	do {
		if(*p == a)
			*p = b;
	}
	while(*p++);
	return *this;
}